

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sos2.h
# Opt level: O0

void __thiscall
mp::
SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOS2FromPL(SOS2Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,ItemType_conflict18 *cc)

{
  AlgConRhs<_1> rr;
  AlgConRhs<1> rr_00;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *this_01;
  SOS_1or2_Constraint<2> *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  __type __x;
  double dVar3;
  NodeRange NVar4;
  NodeRange NVar5;
  vector<double,_std::allocator<double>_> Ckr_1_dp1;
  vector<double,_std::allocator<double>_> Ckr_0_d;
  int k;
  vector<int,_std::allocator<int>_> y;
  vector<int,_std::allocator<int>_> lambda;
  int r;
  int d;
  value_type_conflict *in_stack_fffffffffffffca8;
  NodeIndexRange in_stack_fffffffffffffcb0;
  ValueNode *in_stack_fffffffffffffcb8;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffcc0;
  NodeIndexRange in_stack_fffffffffffffcc8;
  ValueNode *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffce0;
  value_type vVar6;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcf8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd00;
  Type in_stack_fffffffffffffd0c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd18;
  LinTerms *in_stack_fffffffffffffd20;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffd28;
  AlgConRhs<_1> local_1a8 [36];
  undefined8 local_88;
  int local_64;
  vector<int,_std::allocator<int>_> local_60;
  undefined4 local_34;
  int local_18;
  int local_14;
  SOS_1or2_Constraint<2> *local_10;
  
  local_10 = in_RSI;
  this_00 = SOS_1or2_Constraint<2>::get_vars(in_RSI);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(this_00);
  local_14 = (int)sVar1 + -1;
  __x = std::log2<int>(0);
  dVar3 = ceil(__x);
  local_18 = (int)dVar3;
  SOS_1or2_Constraint<2>::get_vars(local_10);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_34 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
             (value_type *)in_stack_fffffffffffffca8);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20,
                      (double)in_stack_fffffffffffffd18,(double)in_stack_fffffffffffffd10,
                      in_stack_fffffffffffffd0c);
  NVar4.ir_ = in_stack_fffffffffffffcc8;
  NVar4.pvn_ = in_stack_fffffffffffffcd0;
  NVar5.ir_ = in_stack_fffffffffffffcb0;
  NVar5.pvn_ = in_stack_fffffffffffffcb8;
  for (local_64 = 1; local_64 <= local_18; local_64 = local_64 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)(local_64 + -1));
    vVar6 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)NVar5.ir_);
    *pvVar2 = vVar6;
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::GetZZIExtendedColumn
              ((MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)NVar4.ir_,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
               (int)in_stack_fffffffffffffcc0,NVar5.pvn_._4_4_,(int)NVar5.pvn_);
    local_88 = 0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)NVar5.ir_,in_stack_fffffffffffffca8);
    this_01 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
              BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ::GetMC(in_RDI);
    LinTerms::LinTerms(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10
                      );
    AlgConRhs<-1>::AlgConRhs(local_1a8,0.0);
    rr.rhs_._4_4_ = vVar6;
    rr.rhs_._0_4_ = in_stack_fffffffffffffce0;
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (this_01,(LinTerms *)NVar4.pvn_,rr,NVar4.ir_.end_._3_1_);
    NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)CONCAT44(vVar6,in_stack_fffffffffffffce0),this_01);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar5.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::GetZZIExtendedColumn
              ((MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)NVar4.ir_,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
               (int)in_stack_fffffffffffffcc0,NVar5.pvn_._4_4_,(int)NVar5.pvn_);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)NVar5.ir_,in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcc0 =
         BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         ::GetMC(in_RDI);
    LinTerms::LinTerms(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10
                      );
    AlgConRhs<1>::AlgConRhs((AlgConRhs<1> *)&stack0xfffffffffffffd08,0.0);
    rr_00.rhs_._4_4_ = vVar6;
    rr_00.rhs_._0_4_ = in_stack_fffffffffffffce0;
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)this_01,
               (LinTerms *)NVar4.pvn_,rr_00,NVar4.ir_.end_._3_1_);
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)CONCAT44(vVar6,in_stack_fffffffffffffce0),
                       (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)this_01);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar5.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void ConvertSOS2FromPL(const ItemType& cc) {
    const int d = int(cc.get_vars().size()-1);
    const int r = int(std::ceil(std::log2(d)));
    auto lambda = cc.get_vars();
    lambda.push_back(-1);             // reserve for 1 extra var
    auto y = GetMC().AddVars_returnIds(r, 0.0, 1e100, var::INTEGER);
    for (int k=1; k<=r; ++k) {
      lambda.back() = y[k-1];
      auto Ckr_0_d = GetMC().GetZZIExtendedColumn(r, k, 0, d);
      Ckr_0_d.push_back(-1.0);
      GetMC().AddConstraint(
            LinConLE({std::move(Ckr_0_d), lambda}, {0.0}) );
      auto Ckr_1_dp1 = GetMC().GetZZIExtendedColumn(r, k, 1, d+1);
      Ckr_1_dp1.push_back(-1.0);
      GetMC().AddConstraint(
            LinConGE({std::move(Ckr_1_dp1), lambda}, {0.0}) );
    }
  }